

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavefilt.c
# Opt level: O3

void qmf_wrev(double *in,int N,double *out)

{
  void *__ptr;
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  double dVar4;
  
  __ptr = malloc((long)N * 8);
  if (0 < N) {
    uVar1 = (ulong)(uint)N;
    pdVar2 = in + uVar1;
    uVar3 = 0;
    do {
      pdVar2 = pdVar2 + -1;
      dVar4 = *pdVar2;
      if ((uVar3 & 1) != 0) {
        dVar4 = -dVar4;
      }
      *(double *)((long)__ptr + uVar3 * 8) = dVar4;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    do {
      *out = *(double *)((long)__ptr + uVar1 * 8 + -8);
      out = out + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  free(__ptr);
  return;
}

Assistant:

void qmf_wrev(const double *in, int N, double *out)
{
    double *sigOutTemp;
    sigOutTemp = (double*)malloc(N*sizeof(double));

    qmf_even(in, N, sigOutTemp);
    copy_reverse(sigOutTemp, N, out);

    free(sigOutTemp);
    return;
}